

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::
     call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
               (QPromise<QList<QString>_> *promise,QPromiseResolve<QList<QString>_> *resolve,
               QPromiseReject<QList<QString>_> *reject)

{
  QPromiseReject<QList<QString>> *this;
  QPromiseReject<QList<QString>_> *this_00;
  QPromiseResolve<QList<QString>_> *fulfilled;
  bool bVar1;
  PromiseValue<QList<QString>_> *value;
  PromiseData<QList<QString>_> *pPVar2;
  PromiseError *error;
  QPromiseReject<QList<QString>_> local_70;
  QPromise<QList<QString>_> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromise<void> local_30;
  QPromiseReject<QList<QString>> *local_20;
  QPromiseReject<QList<QString>_> *reject_local;
  QPromiseResolve<QList<QString>_> *resolve_local;
  QPromise<QList<QString>_> *promise_local;
  
  local_20 = (QPromiseReject<QList<QString>> *)reject;
  reject_local = (QPromiseReject<QList<QString>_> *)resolve;
  resolve_local = (QPromiseResolve<QList<QString>_> *)promise;
  bVar1 = QtPromise::QPromiseBase<QList<QString>_>::isFulfilled
                    (&promise->super_QPromiseBase<QList<QString>_>);
  this_00 = reject_local;
  if (bVar1) {
    pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>::
             operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>
                         *)(resolve_local + 1));
    value = PromiseData<QList<QString>_>::value(pPVar2);
    QtPromise::QPromiseResolve<QList<QString>>::operator()
              ((QPromiseResolve<QList<QString>> *)this_00,value);
  }
  else {
    bVar1 = QtPromise::QPromiseBase<QList<QString>_>::isRejected
                      ((QPromiseBase<QList<QString>_> *)resolve_local);
    fulfilled = resolve_local;
    this = local_20;
    if (bVar1) {
      pPVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>::
               operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>
                           *)(resolve_local + 1));
      error = PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::error
                        (&pPVar2->
                          super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
      QtPromise::QPromiseReject<QList<QString>>::operator()(this,error);
    }
    else {
      QtPromise::QPromiseResolve<QList<QString>_>::QPromiseResolve
                ((QPromiseResolve<QList<QString>_> *)&local_48,
                 (QPromiseResolve<QList<QString>_> *)reject_local);
      QtPromise::QPromise<QList<QString>_>::QPromise
                (&local_48.promise,(QPromise<QList<QString>_> *)resolve_local);
      QtPromise::QPromiseReject<QList<QString>_>::QPromiseReject
                (&local_70,(QPromiseReject<QList<QString>_> *)local_20);
      QtPromise::QPromise<QList<QString>_>::QPromise
                (local_68,(QPromise<QList<QString>_> *)resolve_local);
      QtPromise::QPromiseBase<QList<QString>>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)::_lambda()_2_>
                ((QPromiseBase<QList<QString>> *)&local_30,(anon_class_24_2_e6a34898 *)fulfilled,
                 &local_48);
      QtPromise::QPromise<void>::~QPromise(&local_30);
      call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }